

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  uint uVar1;
  undefined4 uVar2;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  void *in_R9;
  uint testsize;
  LodePNGCompressSettings zlibsettings;
  uchar *dummy;
  uint bestType_2;
  uint type_3;
  size_t smallest_2;
  ucvector attempt_2 [5];
  size_t size [5];
  uchar type_2;
  size_t inindex_1;
  size_t outindex_1;
  float p;
  uint count [256];
  uint bestType_1;
  uint type_1;
  float smallest_1;
  ucvector attempt_1 [5];
  float sum_1 [5];
  uchar s;
  uchar bestType;
  uchar type;
  size_t smallest;
  ucvector attempt [5];
  size_t sum [5];
  size_t inindex;
  size_t outindex;
  LodePNGFilterStrategy strategy;
  uint error;
  uint y;
  uint x;
  uchar *prevline;
  size_t bytewidth;
  size_t linebytes;
  uint bpp;
  undefined4 in_stack_fffffffffffff908;
  float fVar3;
  undefined4 in_stack_fffffffffffff90c;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  undefined4 in_stack_fffffffffffff918;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff924;
  undefined7 in_stack_fffffffffffff928;
  uchar in_stack_fffffffffffff92f;
  size_t in_stack_fffffffffffff930;
  size_t in_stack_fffffffffffff938;
  size_t length;
  uchar *in_stack_fffffffffffff940;
  uchar *prevline_00;
  uchar *in_stack_fffffffffffff948;
  uchar *in_stack_fffffffffffff950;
  uint local_6a8;
  uint local_6a4;
  ulong local_6a0;
  ucvector local_698 [5];
  ulong local_618 [6];
  undefined1 local_5e1;
  long local_5e0;
  long local_5d8;
  float local_5cc;
  uint auStack_5c8 [257];
  uint local_1c4;
  uint local_1c0;
  float local_1bc;
  ucvector local_1b8 [5];
  float afStack_138 [5];
  byte local_123;
  byte local_122;
  byte local_121;
  ulong local_120;
  ucvector local_118;
  uchar *apuStack_100 [13];
  ulong auStack_98 [5];
  long local_70;
  long local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  ulong local_48;
  ulong local_40;
  uint local_34;
  void *local_30;
  int *local_28;
  uint local_20;
  int local_1c;
  long local_18;
  long local_10;
  uint local_4;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_34 = lodepng_get_bpp((LodePNGColorMode *)0x2bf8f2);
  local_40 = (ulong)(local_1c * local_34 + 7 >> 3);
  local_48 = (ulong)(local_34 + 7 >> 3);
  local_50 = 0;
  local_5c = 0;
  local_60 = *(int *)((long)local_30 + 0x38);
  if ((*(int *)((long)local_30 + 0x34) != 0) && ((*local_28 == 3 || ((uint)local_28[1] < 8)))) {
    local_60 = 0;
  }
  if (local_34 == 0) {
    local_4 = 0x1f;
  }
  else {
    if (local_60 == 0) {
      for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
        local_68 = (local_40 + 1) * (ulong)local_58;
        local_70 = local_40 * local_58;
        *(undefined1 *)(local_10 + local_68) = 0;
        filterScanline(in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940
                       ,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                       in_stack_fffffffffffff92f);
        local_50 = local_18 + local_70;
      }
    }
    else if (local_60 == 1) {
      local_120 = 0;
      local_122 = 0;
      for (local_121 = 0; local_121 != 5; local_121 = local_121 + 1) {
        ucvector_init(&local_118 + local_121);
        uVar1 = ucvector_resize((ucvector *)
                                CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                                0x2bfb12);
        if (uVar1 == 0) {
          return 0x53;
        }
      }
      if (local_5c == 0) {
        for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
          for (local_121 = 0; local_121 != 5; local_121 = local_121 + 1) {
            filterScanline(in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                           in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                           in_stack_fffffffffffff930,in_stack_fffffffffffff92f);
            auStack_98[local_121] = 0;
            if (local_121 == 0) {
              for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
                auStack_98[0] = local_118.data[local_54] + auStack_98[0];
              }
            }
            else {
              for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
                local_123 = (&local_118)[local_121].data[local_54];
                if (local_123 < 0x80) {
                  uVar1 = (uint)local_123;
                }
                else {
                  uVar1 = 0xff - local_123;
                }
                auStack_98[local_121] = (ulong)uVar1 + auStack_98[local_121];
              }
            }
            if ((local_121 == 0) || (auStack_98[local_121] < local_120)) {
              local_122 = local_121;
              local_120 = auStack_98[local_121];
            }
          }
          local_50 = local_18 + local_58 * local_40;
          *(byte *)(local_10 + (ulong)local_58 * (local_40 + 1)) = local_122;
          for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
            *(uchar *)(local_10 + (ulong)local_58 * (local_40 + 1) + 1 + (ulong)local_54) =
                 (&local_118)[local_122].data[local_54];
          }
        }
      }
      for (local_121 = '\0'; local_121 != '\x05'; local_121 = local_121 + '\x01') {
        ucvector_cleanup((void *)0x2bfea9);
      }
    }
    else if (local_60 == 2) {
      local_1bc = 0.0;
      local_1c4 = 0;
      for (local_1c0 = 0; local_1c0 != 5; local_1c0 = local_1c0 + 1) {
        ucvector_init(local_1b8 + local_1c0);
        uVar1 = ucvector_resize((ucvector *)
                                CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                                0x2bff38);
        if (uVar1 == 0) {
          return 0x53;
        }
      }
      for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
        for (local_1c0 = 0; local_1c0 != 5; local_1c0 = local_1c0 + 1) {
          filterScanline(in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                         in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                         in_stack_fffffffffffff930,in_stack_fffffffffffff92f);
          for (local_54 = 0; local_54 != 0x100; local_54 = local_54 + 1) {
            auStack_5c8[local_54] = 0;
          }
          for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
            auStack_5c8[local_1b8[local_1c0].data[local_54]] =
                 auStack_5c8[local_1b8[local_1c0].data[local_54]] + 1;
          }
          auStack_5c8[local_1c0] = auStack_5c8[local_1c0] + 1;
          afStack_138[local_1c0] = 0.0;
          for (local_54 = 0; local_54 != 0x100; local_54 = local_54 + 1) {
            local_5cc = (float)auStack_5c8[local_54] / (float)(local_40 + 1);
            if (auStack_5c8[local_54] == 0) {
              fVar3 = 0.0;
            }
            else {
              fVar3 = flog2(1.0 / local_5cc);
              fVar3 = fVar3 * local_5cc;
            }
            afStack_138[local_1c0] = fVar3 + afStack_138[local_1c0];
          }
          if ((local_1c0 == 0) || (afStack_138[local_1c0] < local_1bc)) {
            local_1c4 = local_1c0;
            local_1bc = afStack_138[local_1c0];
          }
        }
        local_50 = local_18 + local_58 * local_40;
        *(char *)(local_10 + (ulong)local_58 * (local_40 + 1)) = (char)local_1c4;
        for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
          *(uchar *)(local_10 + (ulong)local_58 * (local_40 + 1) + 1 + (ulong)local_54) =
               local_1b8[local_1c4].data[local_54];
        }
      }
      for (local_1c0 = 0; local_1c0 != 5; local_1c0 = local_1c0 + 1) {
        ucvector_cleanup((void *)0x2c034c);
      }
    }
    else if (local_60 == 4) {
      for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
        local_5d8 = (local_40 + 1) * (ulong)local_58;
        local_5e0 = local_40 * local_58;
        local_5e1 = *(undefined1 *)(*(long *)((long)local_30 + 0x40) + (ulong)local_58);
        *(undefined1 *)(local_10 + local_5d8) = local_5e1;
        filterScanline(in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940
                       ,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                       in_stack_fffffffffffff92f);
        local_50 = local_18 + local_5e0;
      }
    }
    else {
      if (local_60 != 3) {
        return 0x58;
      }
      local_6a0 = 0;
      local_6a8 = 0;
      memcpy(&stack0xfffffffffffff920,local_30,0x30);
      uVar4 = 1;
      length = 0;
      prevline_00 = (uchar *)0x0;
      for (local_6a4 = 0; local_6a4 != 5; local_6a4 = local_6a4 + 1) {
        ucvector_init(local_698 + local_6a4);
        ucvector_resize((ucvector *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                        0x2c051b);
      }
      for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
        for (local_6a4 = 0; local_6a4 != 5; local_6a4 = local_6a4 + 1) {
          uVar2 = (undefined4)local_698[local_6a4].size;
          filterScanline(in_stack_fffffffffffff950,in_stack_fffffffffffff948,prevline_00,length,
                         in_stack_fffffffffffff930,in_stack_fffffffffffff92f);
          local_618[local_6a4] = 0;
          in_stack_fffffffffffff950 = (uchar *)0x0;
          zlib_compress((uchar **)CONCAT17(in_stack_fffffffffffff92f,in_stack_fffffffffffff928),
                        (size_t *)CONCAT44(in_stack_fffffffffffff924,uVar4),
                        (uchar *)CONCAT44(uVar2,in_stack_fffffffffffff918),
                        CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                        (LodePNGCompressSettings *)
                        CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
          lodepng_free((void *)0x2c0629);
          if ((local_6a4 == 0) || (local_618[local_6a4] < local_6a0)) {
            local_6a8 = local_6a4;
            local_6a0 = local_618[local_6a4];
          }
        }
        local_50 = local_18 + local_58 * local_40;
        *(char *)(local_10 + (ulong)local_58 * (local_40 + 1)) = (char)local_6a8;
        for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
          *(uchar *)(local_10 + (ulong)local_58 * (local_40 + 1) + 1 + (ulong)local_54) =
               local_698[local_6a8].data[local_54];
        }
      }
      for (local_6a4 = 0; local_6a4 != 5; local_6a4 = local_6a4 + 1) {
        ucvector_cleanup((void *)0x2c0773);
      }
    }
    local_4 = local_5c;
  }
  return local_4;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type].data[x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type].data[x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
      }
    }

    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type].data[x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }

    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      ucvector_resize(&attempt[type], linebytes); /*todo: give error if resize failed*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = attempt[type].size;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type].data, testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }
    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}